

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::StringUtilTest_EndsWithNoCase_Test::~StringUtilTest_EndsWithNoCase_Test
          (StringUtilTest_EndsWithNoCase_Test *this)

{
  StringUtilTest_EndsWithNoCase_Test *this_local;
  
  ~StringUtilTest_EndsWithNoCase_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StringUtilTest, EndsWithNoCase) {
  EXPECT_TRUE(bssl::string_util::EndsWithNoCase("", ""));
  EXPECT_TRUE(bssl::string_util::EndsWithNoCase("mail.google.com", ""));
  EXPECT_TRUE(
      bssl::string_util::EndsWithNoCase("mail.google.com", "maIL.GOoGlE.cOm"));
  EXPECT_TRUE(
      bssl::string_util::EndsWithNoCase("mail.google.com", ".gOoGlE.cOm"));
  EXPECT_TRUE(
      bssl::string_util::EndsWithNoCase("MAil~-.google.cOm", "-.gOoGlE.CoM"));
  EXPECT_TRUE(bssl::string_util::EndsWithNoCase("mail\x80.google.com",
                                                "\x80.GOoGlE.cOm"));
  EXPECT_FALSE(
      bssl::string_util::EndsWithNoCase("mail.google.com", "pOoGlE.com"));
  EXPECT_FALSE(bssl::string_util::EndsWithNoCase("mail\x80.google.com",
                                                 "\x81.GOoGlE.cOm"));
  EXPECT_FALSE(
      bssl::string_util::EndsWithNoCase("mail.google.co", ".GOoGlE.cOm"));
  EXPECT_FALSE(
      bssl::string_util::EndsWithNoCase("mail.google.com", ".GOoGlE.cO"));
  EXPECT_FALSE(
      bssl::string_util::EndsWithNoCase("mail.google.com", "mail.google.com1"));
  EXPECT_FALSE(
      bssl::string_util::EndsWithNoCase("mail.google.com", "1mail.google.com"));
}